

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall
QCborContainerPrivate::decodeValueFromCbor
          (QCborContainerPrivate *this,QCborStreamReader *reader,int remainingRecursionDepth)

{
  byte bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QCborValue result;
  anon_union_8_2_4ee71171_for_Element_0 local_38;
  QCborContainerPrivate *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = reader->type_;
  uVar2 = (uint)bVar1;
  if (bVar1 < 0xa0) {
    if (bVar1 < 0x40) {
      if ((bVar1 == 0) || (bVar1 == 0x20)) goto LAB_002e0610;
    }
    else {
      if ((uVar2 == 0x40) || (uVar2 == 0x60)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          decodeStringFromCbor(this,reader);
          return;
        }
        goto LAB_002e06cb;
      }
      if (bVar1 == 0x80) goto LAB_002e05b1;
    }
  }
  else if (uVar2 < 0xf9) {
    if (bVar1 == 0xa0) {
LAB_002e05b1:
      local_30 = createContainerFromCbor(reader,remainingRecursionDepth);
      local_28 = 0xaaaaaaaa000000a0;
      local_38.value = -1;
      insertAt(this,(this->elements).d.size,(QCborValue *)&local_38,MoveContainer);
    }
    else if (bVar1 == 0xc0) {
      taggedValueFromCbor((QCborValue *)&local_38,reader,remainingRecursionDepth);
      insertAt(this,(this->elements).d.size,(QCborValue *)&local_38,MoveContainer);
    }
    else if (bVar1 == 0xe0) goto LAB_002e0610;
  }
  else if (uVar2 - 0xf9 < 3) {
LAB_002e0610:
    _local_38 = decodeBasicValueFromCbor(reader);
    QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element>
              ((QPodArrayOps<QtCbor::Element> *)&this->elements,(this->elements).d.size,
               (Element *)&local_38);
    QList<QtCbor::Element>::end(&this->elements);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_002e06cb:
  __stack_chk_fail();
}

Assistant:

void QCborContainerPrivate::decodeValueFromCbor(QCborStreamReader &reader, int remainingRecursionDepth)
{
    QCborStreamReader::Type t = reader.type();
    switch (t) {
    case QCborStreamReader::UnsignedInteger:
    case QCborStreamReader::NegativeInteger:
    case QCborStreamReader::SimpleType:
    case QCborStreamReader::Float16:
    case QCborStreamReader::Float:
    case QCborStreamReader::Double:
        elements.append(decodeBasicValueFromCbor(reader));
        break;

    case QCborStreamReader::ByteArray:
    case QCborStreamReader::String:
        decodeStringFromCbor(reader);
        break;

    case QCborStreamReader::Array:
    case QCborStreamReader::Map:
        return append(makeValue(t == QCborStreamReader::Array ? QCborValue::Array : QCborValue::Map, -1,
                                createContainerFromCbor(reader, remainingRecursionDepth),
                                MoveContainer));

    case QCborStreamReader::Tag:
        return append(taggedValueFromCbor(reader, remainingRecursionDepth));

    case QCborStreamReader::Invalid:
        return;                 // probably a decode error
    }
}